

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall
diligent_spirv_cross::CompilerGLSL::type_can_zero_initialize(CompilerGLSL *this,SPIRType *type)

{
  bool bVar1;
  uint32_t id;
  bool *pbVar2;
  TypedID<(diligent_spirv_cross::Types)1> *pTVar3;
  SPIRType *type_00;
  TypedID<(diligent_spirv_cross::Types)1> *memb;
  TypedID<(diligent_spirv_cross::Types)1> *__end1_1;
  TypedID<(diligent_spirv_cross::Types)1> *__begin1_1;
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,_8UL> *__range1_1;
  bool *literal;
  bool *__end1;
  bool *__begin1;
  SmallVector<bool,_8UL> *__range1;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  
  if ((type->pointer & 1U) == 0) {
    bVar1 = VectorView<unsigned_int>::empty(&(type->array).super_VectorView<unsigned_int>);
    if ((bVar1) || (((this->options).flatten_multidimensional_arrays & 1U) == 0)) {
      __end1 = VectorView<bool>::begin(&(type->array_size_literal).super_VectorView<bool>);
      pbVar2 = VectorView<bool>::end(&(type->array_size_literal).super_VectorView<bool>);
      for (; __end1 != pbVar2; __end1 = __end1 + 1) {
        if ((*__end1 & 1U) == 0) {
          return false;
        }
      }
      __end1_1 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>::begin
                           (&(type->member_types).
                             super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                           );
      pTVar3 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>::end
                         (&(type->member_types).
                           super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                         );
      for (; __end1_1 != pTVar3; __end1_1 = __end1_1 + 1) {
        id = TypedID::operator_cast_to_unsigned_int((TypedID *)__end1_1);
        type_00 = Compiler::get<diligent_spirv_cross::SPIRType>(&this->super_Compiler,id);
        bVar1 = type_can_zero_initialize(this,type_00);
        if (!bVar1) {
          return false;
        }
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CompilerGLSL::type_can_zero_initialize(const SPIRType &type) const
{
	if (type.pointer)
		return false;

	if (!type.array.empty() && options.flatten_multidimensional_arrays)
		return false;

	for (auto &literal : type.array_size_literal)
		if (!literal)
			return false;

	for (auto &memb : type.member_types)
		if (!type_can_zero_initialize(get<SPIRType>(memb)))
			return false;

	return true;
}